

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
* __thiscall Kandinsky::Expression::derivatives(Expression *this)

{
  bool bVar1;
  reference this_00;
  undefined8 *in_RSI;
  map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<Variable,_Expression>_>::value,_pair<iterator,_bool>_>
  _Var2;
  Variable *variable;
  iterator __end1;
  iterator __begin1;
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  *__range1;
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  variableSet;
  map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
  *derivativeMap;
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  _Rb_tree_iterator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>
  in_stack_ffffffffffffff08;
  _Self local_70;
  _Self local_68;
  undefined1 *local_60;
  undefined1 local_48 [55];
  byte local_11;
  
  local_11 = 0;
  std::
  map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
  ::map((map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
         *)0x1257be);
  (**(code **)*in_RSI)(local_48);
  local_60 = local_48;
  local_68._M_node =
       (_Base_ptr)
       std::
       set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
       ::begin(in_stack_fffffffffffffef8);
  local_70._M_node =
       (_Base_ptr)
       std::
       set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
       ::end(in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_const_iterator<Kandinsky::Variable>::operator*
                        ((_Rb_tree_const_iterator<Kandinsky::Variable> *)
                         CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    differentiate((Expression *)in_stack_ffffffffffffff08._M_node,
                  (Variable *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    std::make_pair<Kandinsky::Variable_const&,Kandinsky::Expression>
              ((Variable *)in_stack_ffffffffffffff08._M_node,
               (Expression *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    _Var2 = std::
            map<Kandinsky::Variable,Kandinsky::Expression,Kandinsky::VariableLessThanComparator,std::allocator<std::pair<Kandinsky::Variable_const,Kandinsky::Expression>>>
            ::insert<std::pair<Kandinsky::Variable,Kandinsky::Expression>>
                      ((map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
                        *)this_00,
                       (pair<Kandinsky::Variable,_Kandinsky::Expression> *)
                       in_stack_ffffffffffffff08._M_node);
    in_stack_ffffffffffffff08 = _Var2.first._M_node;
    in_stack_ffffffffffffff07 = _Var2.second;
    std::pair<Kandinsky::Variable,_Kandinsky::Expression>::~pair
              ((pair<Kandinsky::Variable,_Kandinsky::Expression> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    ~Expression((Expression *)0x1258b6);
    std::_Rb_tree_const_iterator<Kandinsky::Variable>::operator++
              ((_Rb_tree_const_iterator<Kandinsky::Variable> *)
               CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  }
  local_11 = 1;
  std::
  set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  ::~set((set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
          *)0x12594c);
  if ((local_11 & 1) == 0) {
    std::
    map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
    ::~map((map<Kandinsky::Variable,_Kandinsky::Expression,_Kandinsky::VariableLessThanComparator,_std::allocator<std::pair<const_Kandinsky::Variable,_Kandinsky::Expression>_>_>
            *)0x125971);
  }
  return in_RDI;
}

Assistant:

std::map<Variable, Expression, VariableLessThanComparator> Expression::derivatives() const
    {
        std::map<Variable, Expression, VariableLessThanComparator> derivativeMap;
        std::set<Variable, VariableLessThanComparator> variableSet = variables();
        for (auto& variable : variableSet)
        {
            derivativeMap.insert(std::make_pair(variable, differentiate(variable)));
        }
        return derivativeMap;
    }